

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  bool bVar1;
  Nullable<const_char_*> c_str;
  string_view pc;
  AlphaNum local_d0;
  AlphaNum local_a0;
  size_t local_70;
  size_t local_68;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string_view p;
  DescriptorIndex *index_local;
  SymbolEntry *this_local;
  
  p._M_str = (char *)index;
  _local_30 = package(this,index);
  local_70 = (size_t)local_30;
  local_68 = p._M_len;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_60,_local_30);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  c_str = ".";
  if (bVar1) {
    c_str = "";
  }
  absl::lts_20240722::AlphaNum::AlphaNum(&local_a0,c_str);
  pc = symbol(this,(DescriptorIndex *)p._M_str);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_d0,pc);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_60,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return absl::StrCat(p, p.empty() ? "" : ".", symbol(index));
    }